

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

int __thiscall Instructions::jumpInstruction(Instructions *this,string *name,int sign,int offset)

{
  value_type vVar1;
  value_type vVar2;
  ostream *poVar3;
  byte *pbVar4;
  reference pvVar5;
  reference pvVar6;
  uint16_t jump;
  value_type tape;
  int offset_local;
  int sign_local;
  string *name_local;
  Instructions *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)name);
  std::operator<<(poVar3," ");
  pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->code,(long)(offset + 1));
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->names,(ulong)*pbVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)pvVar5);
  std::operator<<(poVar3," ");
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->code,(long)(offset + 2));
  vVar1 = *pvVar6;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->code,(long)(offset + 3));
  vVar2 = *pvVar6;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,offset);
  poVar3 = std::operator<<(poVar3," -> ");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,offset + 4 + sign * (uint)CONCAT11(vVar1,vVar2));
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return offset + 4;
}

Assistant:

int Instructions::jumpInstruction(const std::string& name, int sign, int offset)
{
    std::cout << name << " ";
    auto tape = code[static_cast<int>(offset + 1)];
    std::cout << names[tape] << " ";
    uint16_t jump = (uint16_t)(code[static_cast<int>(offset + 2)] << 8);
    jump |= code[static_cast<int>(offset + 3)];
    std::cout << offset << " -> " << offset + 4 + sign * jump << std::endl;
    return offset + 4;
}